

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::StartObject(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
              *this,Context *context)

{
  SizeType SVar1;
  bool bVar2;
  int iVar3;
  ValueType *pVVar4;
  Ch *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((this->type_ & 4) == 0) {
    pVVar4 = GetObjectString();
    DisallowedType(this,context,pVVar4);
    context->invalidCode = kValidateErrorType;
    pVVar4 = GetTypeString();
    pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar4);
    context->invalidKeyword = pCVar5;
    return false;
  }
  if ((this->hasDependencies_ != false) || (this->hasRequired_ == true)) {
    iVar3 = (*context->factory->_vptr_ISchemaStateFactory[7])();
    context->propertyExist = (bool *)CONCAT44(extraout_var,iVar3);
    memset((bool *)CONCAT44(extraout_var,iVar3),0,(ulong)this->propertyCount_);
  }
  if (this->patternProperties_ != (PatternProperty *)0x0) {
    SVar1 = this->patternPropertyCount_;
    iVar3 = (*context->factory->_vptr_ISchemaStateFactory[7])();
    context->patternPropertiesSchemas = (SchemaType **)CONCAT44(extraout_var_00,iVar3);
    context->patternPropertiesSchemaCount = 0;
    memset((SchemaType **)CONCAT44(extraout_var_00,iVar3),0,(ulong)(SVar1 + 1) << 3);
  }
  bVar2 = CreateParallelValidator(this,context);
  return bVar2;
}

Assistant:

bool StartObject(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::StartObject");
        if (!(type_ & (1 << kObjectSchemaType))) {
            DisallowedType(context, GetObjectString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (hasDependencies_ || hasRequired_) {
            context.propertyExist = static_cast<bool*>(context.factory.MallocState(sizeof(bool) * propertyCount_));
            std::memset(context.propertyExist, 0, sizeof(bool) * propertyCount_);
        }

        if (patternProperties_) { // pre-allocate schema array
            SizeType count = patternPropertyCount_ + 1; // extra for valuePatternValidatorType
            context.patternPropertiesSchemas = static_cast<const SchemaType**>(context.factory.MallocState(sizeof(const SchemaType*) * count));
            context.patternPropertiesSchemaCount = 0;
            std::memset(context.patternPropertiesSchemas, 0, sizeof(SchemaType*) * count);
        }

        return CreateParallelValidator(context);
    }